

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * Catch::anon_unknown_23::escape(string *__return_storage_ptr__,string *str)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"|",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"||",&local_52);
  replaceInPlace(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"\'",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|\'",&local_52);
  replaceInPlace(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"\n",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|n",&local_52);
  replaceInPlace(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"\r",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|r",&local_52);
  replaceInPlace(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"[",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|[",&local_52);
  replaceInPlace(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"]",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"|]",&local_52);
  replaceInPlace(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string escape(std::string const &str) {
            std::string escaped = str;
            replaceInPlace(escaped, "|", "||");
            replaceInPlace(escaped, "'", "|'");
            replaceInPlace(escaped, "\n", "|n");
            replaceInPlace(escaped, "\r", "|r");
            replaceInPlace(escaped, "[", "|[");
            replaceInPlace(escaped, "]", "|]");
            return escaped;
        }